

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDImporter.cpp
# Opt level: O2

void __thiscall Assimp::MMDImporter::MMDImporter(MMDImporter *this)

{
  char cVar1;
  DefaultIOSystem io;
  IOSystem local_38;
  
  BaseImporter::BaseImporter(&this->super_BaseImporter);
  (this->super_BaseImporter)._vptr_BaseImporter = (_func_int **)&PTR_UpdateImporterScale_008c7490;
  (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&this->m_strAbsPath,"",(allocator *)&local_38);
  local_38.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._vptr_IOSystem = (_func_int **)&PTR__IOSystem_007f3928;
  cVar1 = DefaultIOSystem::getOsSeparator((DefaultIOSystem *)&local_38);
  std::__cxx11::string::operator=((string *)&this->m_strAbsPath,cVar1);
  IOSystem::~IOSystem(&local_38);
  return;
}

Assistant:

MMDImporter::MMDImporter()
: m_Buffer()
, m_strAbsPath("") {
    DefaultIOSystem io;
    m_strAbsPath = io.getOsSeparator();
}